

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupNode *pCVar1;
  SerialArena *arena;
  char **ppcVar2;
  LogMessage *pLVar3;
  bool bVar4;
  _func_void_void_ptr *cleanup_local;
  void *elem_local;
  ThreadSafeArena *this_local;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  LogMessageFatal local_a8 [23];
  Voidify local_91;
  SerialArena *local_90;
  char *local_88 [2];
  char *end;
  byte local_61;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  CleanupNode *local_38;
  CleanupNode *local_30;
  CleanupNode *local_28;
  long local_20;
  CleanupNode *local_18;
  
  arena = GetSerialArena(this);
  if ((arena->cleanup_list_).next_ < (arena->cleanup_list_).limit_) {
    pCVar1 = (arena->cleanup_list_).next_;
    (arena->cleanup_list_).next_ = pCVar1 + 1;
    pCVar1->elem = elem;
    pCVar1->destructor = cleanup;
  }
  else {
    internal::cleanup::ChunkList::AddFallback(&arena->cleanup_list_,elem,cleanup,arena);
  }
  bVar4 = true;
  if ((arena->cleanup_list_).prefetch_ptr_ != (char *)0x0) {
    bVar4 = (arena->cleanup_list_).head_ <= (Chunk *)(arena->cleanup_list_).prefetch_ptr_;
  }
  local_90 = arena;
  if (!bVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,
               "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
              );
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
               ,0x137,local_b8._M_len,local_b8._M_str);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a8);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a8);
  }
  local_28 = (arena->cleanup_list_).next_;
  local_30 = (arena->cleanup_list_).limit_;
  local_38 = (CleanupNode *)(arena->cleanup_list_).prefetch_ptr_;
  local_20 = 0x180;
  local_18 = local_38;
  if ((long)local_38 - (long)local_28 < 0x181) {
    if (local_38 < local_30) {
      ppcVar2 = std::max<char_const*>((char **)&local_28,(char **)&local_38);
      local_38 = (CleanupNode *)*ppcVar2;
      local_61 = 0;
      if (local_38 == (CleanupNode *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_60,"prefetch_ptr != nullptr");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
                   ,0x123,local_60._M_len,local_60._M_str);
        local_61 = 1;
        pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_50);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar3);
      }
      if ((local_61 & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
      }
      local_88[0] = (char *)((long)&local_38->elem + local_20);
      ppcVar2 = std::min<char_const*>((char **)&local_30,local_88);
      for (; local_38 < (CleanupNode *)*ppcVar2; local_38 = local_38 + 4) {
      }
    }
    local_18 = local_38;
  }
  (arena->cleanup_list_).prefetch_ptr_ = (char *)local_18;
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}